

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>::SharedPtr
          (SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_> *this,
          Move<vk::VkCommandBuffer_s_*> *ptr)

{
  Move<vk::VkCommandBuffer_s_*> *pMVar1;
  SharedPtrState<vk::refdetails::Move<vk::VkCommandBuffer_s_*>,_de::DefaultDeleter<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>
  *pSVar2;
  DefaultDeleter<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_> local_25 [13];
  Move<vk::VkCommandBuffer_s_*> *local_18;
  Move<vk::VkCommandBuffer_s_*> *ptr_local;
  SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_> *this_local;
  
  this->m_ptr = (Move<vk::VkCommandBuffer_s_*> *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (Move<vk::VkCommandBuffer_s_*> *)this;
  pSVar2 = (SharedPtrState<vk::refdetails::Move<vk::VkCommandBuffer_s_*>,_de::DefaultDeleter<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>
            *)operator_new(0x20);
  pMVar1 = local_18;
  DefaultDeleter<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>::DefaultDeleter(local_25);
  SharedPtrState<vk::refdetails::Move<vk::VkCommandBuffer_s_*>,_de::DefaultDeleter<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>
  ::SharedPtrState(pSVar2,pMVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}